

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::_::ForkHubBase::fire(ForkHubBase *this)

{
  ForkBranchBase *this_00;
  Event *extraout_RDX;
  Event *pEVar1;
  Event *extraout_RDX_00;
  long in_RSI;
  ForkBranchBase **ppFVar2;
  Maybe<kj::Own<kj::_::Event>_> MVar3;
  NullableValue<kj::Exception> exception;
  Runnable local_2f0 [2];
  NullableValue<kj::Exception> local_2e0;
  NullableValue<kj::Exception> local_180;
  
  (**(code **)(**(long **)(in_RSI + 0x40) + 0x10))
            (*(long **)(in_RSI + 0x40),*(undefined8 *)(in_RSI + 0x48));
  local_2f0[0]._vptr_Runnable = (_func_int **)&PTR_run_0042f0c8;
  runCatchingExceptions((Maybe<kj::Exception> *)&local_180,local_2f0);
  NullableValue<kj::Exception>::NullableValue(&local_2e0,&local_180);
  NullableValue<kj::Exception>::~NullableValue(&local_180);
  if (local_2e0.isSet == true) {
    ExceptionOrValue::addException(*(ExceptionOrValue **)(in_RSI + 0x48),&local_2e0.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_2e0);
  ppFVar2 = (ForkBranchBase **)(in_RSI + 0x50);
  pEVar1 = extraout_RDX;
  while (this_00 = *ppFVar2, this_00 != (ForkBranchBase *)0x0) {
    ForkBranchBase::hubReady(this_00);
    *this_00->prevPtr = (ForkBranchBase *)0x0;
    this_00->prevPtr = (ForkBranchBase **)0x0;
    pEVar1 = extraout_RDX_00;
    ppFVar2 = &this_00->next;
  }
  **(undefined8 **)(in_RSI + 0x58) = 0;
  *(undefined8 *)(in_RSI + 0x58) = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  MVar3.ptr.ptr = pEVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> ForkHubBase::fire() {
  // Dependency is ready.  Fetch its result and then delete the node.
  inner->get(resultRef);
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
    inner = nullptr;
  })) {
    resultRef.addException(kj::mv(*exception));
  }

  for (auto branch = headBranch; branch != nullptr; branch = branch->next) {
    branch->hubReady();
    *branch->prevPtr = nullptr;
    branch->prevPtr = nullptr;
  }
  *tailBranch = nullptr;

  // Indicate that the list is no longer active.
  tailBranch = nullptr;

  return nullptr;
}